

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::ArrayFeatureType::MergePartialFromCodedStream
          (ArrayFeatureType *this,CodedInputStream *input)

{
  CodedInputStream *input_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  RepeatedField<long> *pRVar5;
  ArrayFeatureType_EnumeratedShapes *value_00;
  ArrayFeatureType_ShapeRange *value_01;
  bool local_8a;
  bool local_89;
  ArrayFeatureType_ArrayDataType local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  ArrayFeatureType *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x1000040d = input;
LAB_0021bf8b:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    if (stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) {
      tag_2 = (uint32)*stack0xffffffffffffff98->buffer_;
      if ((char)*stack0xffffffffffffff98->buffer_ < '\x01') {
        if ((stack0xffffffffffffff98->buffer_end_ <= stack0xffffffffffffff98->buffer_ + 1) ||
           ((*stack0xffffffffffffff98->buffer_ & (stack0xffffffffffffff98->buffer_[1] ^ 0xff)) <
            0x80)) goto LAB_0021c10a;
        uStack_30 = 0x3fff;
        tag_1 = (uint)stack0xffffffffffffff98->buffer_[1] * 0x80 +
                (*stack0xffffffffffffff98->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
        google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_0021c10a:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback
                           (stack0xffffffffffffff98,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    local_74 = local_10;
    p.first = local_74;
    if ((uStack_c & 1) == 0) goto LAB_0021c3cf;
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    input_00 = stack0xffffffffffffff98;
    switch(iVar2) {
    case 1:
      if ((p.first & 0xff) == 10) {
        pRVar5 = mutable_shape(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input_00,pRVar5);
      }
      else {
        if ((p.first & 0xff) != 8) break;
        pRVar5 = mutable_shape(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitiveNoInline<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (1,10,input_00,pRVar5);
      }
      goto joined_r0x0021c2f0;
    case 2:
      if ((p.first & 0xff) == 0x10) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,&local_78);
        if (!bVar1) {
          return false;
        }
        set_datatype(this,local_78);
        goto LAB_0021bf8b;
      }
      break;
    default:
      break;
    case 0x15:
      if ((p.first & 0xff) != 0xaa) break;
      value_00 = mutable_enumeratedshapes(this);
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>
                        (input_00,value_00);
      goto joined_r0x0021c2f0;
    case 0x1f:
      if ((p.first & 0xff) != 0xfa) break;
      value_01 = mutable_shaperange(this);
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::ArrayFeatureType_ShapeRange>
                        (input_00,value_01);
      goto joined_r0x0021c2f0;
    case 0x29:
      if ((p.first & 0xff) == 0x48) {
        clear_defaultOptionalValue(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (stack0xffffffffffffff98,&(this->defaultOptionalValue_).intdefaultvalue_);
        if (!bVar1) {
          return false;
        }
        set_has_intdefaultvalue(this);
        goto LAB_0021bf8b;
      }
      break;
    case 0x33:
      if ((p.first & 0xff) == 0x9d) {
        clear_defaultOptionalValue(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (stack0xffffffffffffff98,&(this->defaultOptionalValue_).floatdefaultvalue_
                          );
        if (!bVar1) {
          return false;
        }
        set_has_floatdefaultvalue(this);
        goto LAB_0021bf8b;
      }
      break;
    case 0x3d:
      if ((p.first & 0xff) == 0xe9) {
        clear_defaultOptionalValue(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (stack0xffffffffffffff98,
                           &(this->defaultOptionalValue_).doubledefaultvalue_);
        if (!bVar1) {
          return false;
        }
        set_has_doubledefaultvalue(this);
        goto LAB_0021bf8b;
      }
    }
LAB_0021c3cf:
    if ((p.first == 0) ||
       (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
       WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    bVar1 = google::protobuf::internal::WireFormatLite::SkipField(stack0xffffffffffffff98,p.first);
joined_r0x0021c2f0:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool ArrayFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ArrayFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 shape = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_shape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_shape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_datatype(static_cast< ::CoreML::Specification::ArrayFeatureType_ArrayDataType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_enumeratedshapes()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_shaperange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 intDefaultValue = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(328u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &defaultOptionalValue_.intdefaultvalue_)));
          set_has_intdefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float floatDefaultValue = 51;
      case 51: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(413u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &defaultOptionalValue_.floatdefaultvalue_)));
          set_has_floatdefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double doubleDefaultValue = 61;
      case 61: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(489u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &defaultOptionalValue_.doubledefaultvalue_)));
          set_has_doubledefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ArrayFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ArrayFeatureType)
  return false;
#undef DO_
}